

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::project_to_R
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,int number_of_function)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_type local_30;
  size_t j;
  size_t i;
  double result;
  int number_of_function_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  
  i = 0;
  j = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->heat_map);
    if (j == sVar1) break;
    local_30 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      sVar1 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if (local_30 == sVar1) break;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->heat_map,j);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,local_30);
      i = (size_t)(*pvVar3 + (double)i);
      local_30 = local_30 + 1;
    }
    j = j + 1;
  }
  return (double)i;
}

Assistant:

double Persistence_heat_maps<Scalling_of_kernels>::project_to_R(int number_of_function) const {
  double result = 0;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      result += this->heat_map[i][j];
    }
  }
  return result;
}